

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O1

int createCellConstraints
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *coverMatrix,int header)

{
  ulong *puVar1;
  ulong uVar2;
  pointer pvVar3;
  long lVar4;
  pointer pvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  uVar2 = (ulong)(uint)header;
  pvVar3 = (coverMatrix->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = 1;
  do {
    uVar2 = (ulong)(int)uVar2;
    lVar6 = 1;
    pvVar5 = pvVar3;
    do {
      uVar7 = uVar2 + 0x3f;
      if (-1 < (long)uVar2) {
        uVar7 = uVar2;
      }
      lVar8 = -0x168;
      do {
        puVar1 = (ulong *)((ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8 +
                          *(long *)((long)&pvVar5[9].super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data + lVar8) +
                          ((long)uVar7 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
        lVar8 = lVar8 + 0x28;
      } while (lVar8 != 0);
      lVar6 = lVar6 + 1;
      uVar2 = uVar2 + 1;
      pvVar5 = pvVar5 + 9;
    } while (lVar6 != 10);
    lVar4 = lVar4 + 1;
    pvVar3 = pvVar3 + 0x51;
  } while (lVar4 != 10);
  return (int)uVar2;
}

Assistant:

int createCellConstraints(vector<vector<bool>> &coverMatrix, int header){
    for (int row = COVER_START_INDEX; row <= SIZE; row++) {
        for (int column = COVER_START_INDEX; column <= SIZE; column++, header++) {
            for (int n = COVER_START_INDEX; n <= SIZE; n++) {
                int index = indexInCoverMatrix(row, column, n);
                
            coverMatrix[index][header] = true;

            }
        }
    }
    return header;
}